

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

iterator * __thiscall pstack::Elf::Notes::iterator::operator++(iterator *this)

{
  bool bVar1;
  size_t sVar2;
  pointer pEVar3;
  __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
  *__lhs;
  __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
  local_28;
  size_t local_20;
  Off newOff;
  iterator *this_local;
  
  local_20 = (ulong)(this->curNote).n_namesz + 0xc + this->offset;
  newOff = (Off)this;
  local_20 = roundup2(local_20,4);
  local_20 = (this->curNote).n_descsz + local_20;
  sVar2 = roundup2(local_20,4);
  local_20 = sVar2;
  pEVar3 = __gnu_cxx::
           __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
           ::operator->(&this->phdrsi);
  if (sVar2 < pEVar3->p_filesz) {
    this->offset = local_20;
  }
  else {
    __lhs = __gnu_cxx::
            __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
            ::operator++(&this->phdrsi);
    local_28._M_current =
         (Elf64_Phdr *)std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(this->phdrs);
    bVar1 = __gnu_cxx::
            operator==<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                      (__lhs,&local_28);
    if (bVar1) {
      this->offset = 0;
      return this;
    }
    startSection(this);
  }
  readNote(this);
  return this;
}

Assistant:

Notes::iterator &Notes::iterator::operator++()
{
    auto newOff = offset;
    newOff += sizeof curNote + curNote.n_namesz;
    newOff = roundup2(newOff, 4);
    newOff += curNote.n_descsz;
    newOff = roundup2(newOff, 4);
    if (newOff >= phdrsi->p_filesz) {
        if (++phdrsi == phdrs.end()) {
            offset = 0;
            return *this;
        }
        startSection();
    } else {
        offset = newOff;
    }
    readNote();
    return *this;
}